

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O1

int ssl_write_certificate_verify(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  mbedtls_ssl_handshake_params *pmVar2;
  uchar uVar3;
  int iVar4;
  mbedtls_ssl_key_cert *pmVar5;
  int iVar6;
  size_t hash_len;
  mbedtls_pk_context *pmVar7;
  char *text;
  long lVar8;
  uchar *hash_00;
  mbedtls_md_type_t md_alg;
  bool bVar9;
  size_t n;
  uchar hash [48];
  undefined8 local_60;
  uchar local_58 [16];
  uchar local_48 [32];
  
  pmVar1 = ssl->transform_negotiate->ciphersuite_info;
  local_60 = 0;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0xb07,"=> write certificate verify");
  iVar4 = mbedtls_ssl_derive_keys(ssl);
  if (iVar4 == 0) {
    if (pmVar1->key_exchange - MBEDTLS_KEY_EXCHANGE_PSK < 4) {
      iVar6 = 0xb14;
    }
    else {
      if (ssl->client_auth != 0) {
        pmVar2 = ssl->handshake;
        if ((pmVar2 == (mbedtls_ssl_handshake_params *)0x0) ||
           (pmVar5 = pmVar2->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) {
          pmVar5 = ssl->conf->key_cert;
        }
        if ((pmVar5 != (mbedtls_ssl_key_cert *)0x0) && (pmVar5->cert != (mbedtls_x509_crt *)0x0)) {
          if ((pmVar2 == (mbedtls_ssl_handshake_params *)0x0) ||
             (pmVar5 = pmVar2->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) {
            pmVar5 = ssl->conf->key_cert;
          }
          if ((pmVar5 == (mbedtls_ssl_key_cert *)0x0) || (pmVar5->key == (mbedtls_pk_context *)0x0))
          {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0xb22,"got no private key for certificate");
            return -0x7600;
          }
          hash_00 = local_58;
          (*pmVar2->calc_verify)(ssl,hash_00);
          if (ssl->minor_ver == 3) {
            bVar9 = ssl->transform_negotiate->ciphersuite_info->mac == MBEDTLS_MD_SHA384;
            ssl->out_msg[4] = bVar9 + '\x04';
            if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
               (pmVar5 = ssl->handshake->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) {
              pmVar5 = ssl->conf->key_cert;
            }
            if (pmVar5 == (mbedtls_ssl_key_cert *)0x0) {
              pmVar7 = (mbedtls_pk_context *)0x0;
            }
            else {
              pmVar7 = pmVar5->key;
            }
            md_alg = bVar9 | MBEDTLS_MD_SHA256;
            uVar3 = mbedtls_ssl_sig_from_pk(pmVar7);
            ssl->out_msg[5] = uVar3;
            lVar8 = 2;
            hash_len = 0;
          }
          else {
            if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
               (pmVar5 = ssl->handshake->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) {
              pmVar5 = ssl->conf->key_cert;
            }
            md_alg = MBEDTLS_MD_NONE;
            if (pmVar5 == (mbedtls_ssl_key_cert *)0x0) {
              pmVar7 = (mbedtls_pk_context *)0x0;
            }
            else {
              pmVar7 = pmVar5->key;
            }
            iVar4 = mbedtls_pk_can_do(pmVar7,MBEDTLS_PK_ECDSA);
            if (iVar4 == 0) {
              hash_len = 0x24;
              lVar8 = 0;
            }
            else {
              hash_len = 0x14;
              hash_00 = local_48;
              lVar8 = 0;
              md_alg = MBEDTLS_MD_SHA1;
            }
          }
          if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
             (pmVar5 = ssl->handshake->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) {
            pmVar5 = ssl->conf->key_cert;
          }
          if (pmVar5 == (mbedtls_ssl_key_cert *)0x0) {
            pmVar7 = (mbedtls_pk_context *)0x0;
          }
          else {
            pmVar7 = pmVar5->key;
          }
          iVar4 = mbedtls_pk_sign(pmVar7,md_alg,hash_00,hash_len,ssl->out_msg + lVar8 + 6,&local_60,
                                  ssl->conf->f_rng,ssl->conf->p_rng);
          if (iVar4 == 0) {
            ssl->out_msg[lVar8 + 4] = local_60._1_1_;
            ssl->out_msg[lVar8 + 5] = (uchar)local_60;
            ssl->out_msglen = lVar8 + 6 + local_60;
            ssl->out_msgtype = 0x16;
            *ssl->out_msg = '\x0f';
            ssl->state = ssl->state + 1;
            iVar4 = mbedtls_ssl_write_record(ssl);
            if (iVar4 == 0) {
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                         ,0xb8c,"<= write certificate verify");
              return 0;
            }
            text = "mbedtls_ssl_write_record";
            iVar6 = 0xb88;
          }
          else {
            text = "mbedtls_pk_sign";
            iVar6 = 0xb79;
          }
          goto LAB_00185550;
        }
      }
      iVar6 = 0xb1b;
    }
    iVar4 = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,iVar6,"<= skip write certificate verify");
    ssl->state = ssl->state + 1;
  }
  else {
    text = "mbedtls_ssl_derive_keys";
    iVar6 = 0xb0b;
LAB_00185550:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,iVar6,text,iVar4);
  }
  return iVar4;
}

Assistant:

static int ssl_write_certificate_verify( mbedtls_ssl_context *ssl )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;
    size_t n = 0, offset = 0;
    unsigned char hash[48];
    unsigned char *hash_start = hash;
    mbedtls_md_type_t md_alg = MBEDTLS_MD_NONE;
    unsigned int hashlen;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write certificate verify" ) );

    if( ( ret = mbedtls_ssl_derive_keys( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_derive_keys", ret );
        return( ret );
    }

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write certificate verify" ) );
        ssl->state++;
        return( 0 );
    }

    if( ssl->client_auth == 0 || mbedtls_ssl_own_cert( ssl ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write certificate verify" ) );
        ssl->state++;
        return( 0 );
    }

    if( mbedtls_ssl_own_key( ssl ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no private key for certificate" ) );
        return( MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED );
    }

    /*
     * Make an RSA signature of the handshake digests
     */
    ssl->handshake->calc_verify( ssl, hash );

#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
    if( ssl->minor_ver != MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        /*
         * digitally-signed struct {
         *     opaque md5_hash[16];
         *     opaque sha_hash[20];
         * };
         *
         * md5_hash
         *     MD5(handshake_messages);
         *
         * sha_hash
         *     SHA(handshake_messages);
         */
        hashlen = 36;
        md_alg = MBEDTLS_MD_NONE;

        /*
         * For ECDSA, default hash is SHA-1 only
         */
        if( mbedtls_pk_can_do( mbedtls_ssl_own_key( ssl ), MBEDTLS_PK_ECDSA ) )
        {
            hash_start += 16;
            hashlen -= 16;
            md_alg = MBEDTLS_MD_SHA1;
        }
    }
    else
#endif /* MBEDTLS_SSL_PROTO_SSL3 || MBEDTLS_SSL_PROTO_TLS1 || \
          MBEDTLS_SSL_PROTO_TLS1_1 */
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        /*
         * digitally-signed struct {
         *     opaque handshake_messages[handshake_messages_length];
         * };
         *
         * Taking shortcut here. We assume that the server always allows the
         * PRF Hash function and has sent it in the allowed signature
         * algorithms list received in the Certificate Request message.
         *
         * Until we encounter a server that does not, we will take this
         * shortcut.
         *
         * Reason: Otherwise we should have running hashes for SHA512 and SHA224
         *         in order to satisfy 'weird' needs from the server side.
         */
        if( ssl->transform_negotiate->ciphersuite_info->mac ==
            MBEDTLS_MD_SHA384 )
        {
            md_alg = MBEDTLS_MD_SHA384;
            ssl->out_msg[4] = MBEDTLS_SSL_HASH_SHA384;
        }
        else
        {
            md_alg = MBEDTLS_MD_SHA256;
            ssl->out_msg[4] = MBEDTLS_SSL_HASH_SHA256;
        }
        ssl->out_msg[5] = mbedtls_ssl_sig_from_pk( mbedtls_ssl_own_key( ssl ) );

        /* Info from md_alg will be used instead */
        hashlen = 0;
        offset = 2;
    }
    else
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    if( ( ret = mbedtls_pk_sign( mbedtls_ssl_own_key( ssl ), md_alg, hash_start, hashlen,
                         ssl->out_msg + 6 + offset, &n,
                         ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_pk_sign", ret );
        return( ret );
    }

    ssl->out_msg[4 + offset] = (unsigned char)( n >> 8 );
    ssl->out_msg[5 + offset] = (unsigned char)( n      );

    ssl->out_msglen  = 6 + n + offset;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_CERTIFICATE_VERIFY;

    ssl->state++;

    if( ( ret = mbedtls_ssl_write_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_write_record", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write certificate verify" ) );

    return( ret );
}